

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O2

void __thiscall
cuckoocache_tests::GenerationsTest::
test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>(GenerationsTest *this)

{
  pointer *ppuVar1;
  long lVar2;
  _Elt_pointer pbVar3;
  check_type cVar4;
  size_type sVar5;
  long lVar6;
  _Elt_pointer pbVar7;
  _Elt_pointer pbVar8;
  iterator in_R8;
  iterator in_R9;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  undefined1 auVar13 [16];
  double dVar14;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  _Map_pointer local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  lazy_ostream local_160;
  undefined1 *local_150;
  char **local_148;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  deque<block_activity,_std::allocator<block_activity>_> last_few;
  vector<block_activity,_std::allocator<block_activity>_> hashes;
  uint32_t BLOCK_SIZE;
  cache<uint256,_SignatureCacheHasher> set;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  BLOCK_SIZE = 1000;
  hashes.super__Vector_base<block_activity,_std::allocator<block_activity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashes.super__Vector_base<block_activity,_std::allocator<block_activity>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hashes.super__Vector_base<block_activity,_std::allocator<block_activity>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&set);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes(&set,0x400000);
  std::vector<block_activity,_std::allocator<block_activity>_>::reserve(&hashes,0x51e);
  std::_Deque_base<block_activity,_std::allocator<block_activity>_>::_Deque_base
            (&last_few.super__Deque_base<block_activity,_std::allocator<block_activity>_>);
  uVar11 = 0;
  cVar4 = CHECK_PRED;
  while (cVar4 != 0x51e) {
    sVar5 = std::deque<block_activity,_std::allocator<block_activity>_>::size(&last_few);
    in_stack_fffffffffffffe20 = cVar4;
    if (sVar5 == 0x3c) {
      std::deque<block_activity,_std::allocator<block_activity>_>::pop_front(&last_few);
      in_stack_fffffffffffffe20 = cVar4;
    }
    std::
    deque<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity,std::allocator<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity>>
    ::
    emplace_back<unsigned_int_const&,FastRandomContext&,CuckooCache::cache<uint256,SignatureCacheHasher>&>
              ((deque<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity,std::allocator<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity>>
                *)&last_few,&BLOCK_SIZE,&(this->super_BasicTestingSetup).m_rng,&set);
    pbVar3 = last_few.super__Deque_base<block_activity,_std::allocator<block_activity>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_1b8 = last_few.super__Deque_base<block_activity,_std::allocator<block_activity>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
    uVar10 = 0;
    pbVar7 = last_few.super__Deque_base<block_activity,_std::allocator<block_activity>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pbVar8 = last_few.super__Deque_base<block_activity,_std::allocator<block_activity>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    in_stack_fffffffffffffe24 = uVar11;
    while (pbVar8 != pbVar3) {
      iVar9 = 8;
      while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
        bVar12 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                           (&set,(pbVar8->reads).
                                 super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                 super__Vector_impl_data._M_finish + -1,true);
        uVar10 = uVar10 + bVar12;
        ppuVar1 = &(pbVar8->reads).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
      pbVar8 = pbVar8 + 1;
      if (pbVar8 == pbVar7) {
        pbVar8 = local_1b8[1];
        local_1b8 = local_1b8 + 1;
        pbVar7 = pbVar8 + 0x15;
      }
    }
    sVar5 = std::deque<block_activity,_std::allocator<block_activity>_>::size(&last_few);
    lVar6 = sVar5 << 3;
    auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = 0x45300000;
    local_118 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_110 = "";
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x16e;
    file.m_begin = (iterator)&local_118;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
    dVar14 = (double)uVar10 /
             ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(0.99 < dVar14);
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_170 = "hit > min_hit_rate";
    local_168 = "";
    local_160.m_empty = false;
    local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_150 = boost::unit_test::lazy_ostream::inst;
    local_148 = &local_170;
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_178 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,&local_160,1,0,WARN,
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),(size_t)&local_180,
               0x16e);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    uVar11 = in_stack_fffffffffffffe24 + (dVar14 < 0.999);
    cVar4 = in_stack_fffffffffffffe20 + CHECK_MSG;
  }
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x175;
  file_00.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
             msg_00);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((double)uVar11 / 1310.0 < 0.01);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170 = "double(out_of_tight_tolerance) / double(total) < max_rate_less_than_tight_hit_rate";
  local_168 = "";
  local_160.m_empty = false;
  local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_148 = &local_170;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1a8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_140,&local_160,1,0,WARN,
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),(size_t)&local_1b0,0x175)
  ;
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  std::deque<block_activity,_std::allocator<block_activity>_>::~deque(&last_few);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&set);
  std::vector<block_activity,_std::allocator<block_activity>_>::~vector(&hashes);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test_cache_generations()
{
    // This test checks that for a simulation of network activity, the fresh hit
    // rate is never below 99%, and the number of times that it is worse than
    // 99.9% are less than 1% of the time.
    double min_hit_rate = 0.99;
    double tight_hit_rate = 0.999;
    double max_rate_less_than_tight_hit_rate = 0.01;
    // A cache that meets this specification is therefore shown to have a hit
    // rate of at least tight_hit_rate * (1 - max_rate_less_than_tight_hit_rate) +
    // min_hit_rate*max_rate_less_than_tight_hit_rate = 0.999*99%+0.99*1% == 99.89%
    // hit rate with low variance.

    // We use deterministic values, but this test has also passed on many
    // iterations with non-deterministic values, so it isn't "overfit" to the
    // specific entropy in FastRandomContext(true) and implementation of the
    // cache.
    SeedRandomForTest(SeedRand::ZEROS);

    // block_activity models a chunk of network activity. n_insert elements are
    // added to the cache. The first and last n/4 are stored for removal later
    // and the middle n/2 are not stored. This models a network which uses half
    // the signatures of recently (since the last block) added transactions
    // immediately and never uses the other half.
    struct block_activity {
        std::vector<uint256> reads;
        block_activity(uint32_t n_insert, FastRandomContext& rng, Cache& c)
        {
            std::vector<uint256> inserts;
            inserts.resize(n_insert);
            reads.reserve(n_insert / 2);
            for (uint32_t i = 0; i < n_insert; ++i) {
                uint32_t* ptr = (uint32_t*)inserts[i].begin();
                for (uint8_t j = 0; j < 8; ++j)
                    *(ptr++) = rng.rand32();
            }
            for (uint32_t i = 0; i < n_insert / 4; ++i)
                reads.push_back(inserts[i]);
            for (uint32_t i = n_insert - (n_insert / 4); i < n_insert; ++i)
                reads.push_back(inserts[i]);
            for (const auto& h : inserts)
                c.insert(h);
        }
    };

    const uint32_t BLOCK_SIZE = 1000;
    // We expect window size 60 to perform reasonably given that each epoch
    // stores 45% of the cache size (~472k).
    const uint32_t WINDOW_SIZE = 60;
    const uint32_t POP_AMOUNT = (BLOCK_SIZE / WINDOW_SIZE) / 2;
    const double load = 10;
    const size_t megabytes = 4;
    const size_t bytes = megabytes * (1 << 20);
    const uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));

    std::vector<block_activity> hashes;
    Cache set{};
    set.setup_bytes(bytes);
    hashes.reserve(n_insert / BLOCK_SIZE);
    std::deque<block_activity> last_few;
    uint32_t out_of_tight_tolerance = 0;
    uint32_t total = n_insert / BLOCK_SIZE;
    // we use the deque last_few to model a sliding window of blocks. at each
    // step, each of the last WINDOW_SIZE block_activities checks the cache for
    // POP_AMOUNT of the hashes that they inserted, and marks these erased.
    for (uint32_t i = 0; i < total; ++i) {
        if (last_few.size() == WINDOW_SIZE)
            last_few.pop_front();
        last_few.emplace_back(BLOCK_SIZE, m_rng, set);
        uint32_t count = 0;
        for (auto& act : last_few)
            for (uint32_t k = 0; k < POP_AMOUNT; ++k) {
                count += set.contains(act.reads.back(), true);
                act.reads.pop_back();
            }
        // We use last_few.size() rather than WINDOW_SIZE for the correct
        // behavior on the first WINDOW_SIZE iterations where the deque is not
        // full yet.
        double hit = (double(count)) / (last_few.size() * POP_AMOUNT);
        // Loose Check that hit rate is above min_hit_rate
        BOOST_CHECK(hit > min_hit_rate);
        // Tighter check, count number of times we are less than tight_hit_rate
        // (and implicitly, greater than min_hit_rate)
        out_of_tight_tolerance += hit < tight_hit_rate;
    }
    // Check that being out of tolerance happens less than
    // max_rate_less_than_tight_hit_rate of the time
    BOOST_CHECK(double(out_of_tight_tolerance) / double(total) < max_rate_less_than_tight_hit_rate);
}